

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostkey.c
# Opt level: O0

int hostkey_method_ssh_ecdsa_initPEM
              (LIBSSH2_SESSION *session,char *privkeyfile,uchar *passphrase,void **abstract)

{
  int iVar1;
  EVP_PKEY *pEStack_30;
  int ret;
  EVP_PKEY *ec_ctx;
  void **abstract_local;
  uchar *passphrase_local;
  char *privkeyfile_local;
  LIBSSH2_SESSION *session_local;
  
  pEStack_30 = (EVP_PKEY *)0x0;
  ec_ctx = (EVP_PKEY *)abstract;
  abstract_local = (void **)passphrase;
  passphrase_local = (uchar *)privkeyfile;
  privkeyfile_local = (char *)session;
  if ((abstract != (void **)0x0) && (*abstract != (void *)0x0)) {
    hostkey_method_ssh_ecdsa_dtor(session,abstract);
    *(undefined8 *)ec_ctx = 0;
  }
  iVar1 = _libssh2_ecdsa_new_private
                    (&stack0xffffffffffffffd0,(LIBSSH2_SESSION *)privkeyfile_local,
                     (char *)passphrase_local,(uchar *)abstract_local);
  if (ec_ctx != (EVP_PKEY *)0x0) {
    *(EVP_PKEY **)ec_ctx = pEStack_30;
  }
  return iVar1;
}

Assistant:

static int
hostkey_method_ssh_ecdsa_initPEM(LIBSSH2_SESSION * session,
                                 const char *privkeyfile,
                                 unsigned const char *passphrase,
                                 void **abstract)
{
    libssh2_ecdsa_ctx *ec_ctx = NULL;
    int ret;

    if(abstract && *abstract) {
        hostkey_method_ssh_ecdsa_dtor(session, abstract);
        *abstract = NULL;
    }

    ret = _libssh2_ecdsa_new_private(&ec_ctx, session,
                                     privkeyfile, passphrase);

    if(abstract)
        *abstract = ec_ctx;

    return ret;
}